

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_handle.cpp
# Opt level: O2

void __thiscall
libtorrent::session_handle::dht_direct_request
          (session_handle *this,endpoint *ep,entry *e,client_data_t userdata)

{
  entry copy;
  entry eStack_58;
  char *local_30;
  void *local_28;
  
  local_28 = userdata.m_client_ptr;
  local_30 = userdata.m_type_ptr;
  entry::entry(&eStack_58,e);
  async_call<void(libtorrent::aux::session_impl::*)(boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::entry&,libtorrent::client_data_t),boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::entry&,libtorrent::client_data_t&>
            (this,0x296f96,(basic_endpoint<boost::asio::ip::udp> *)0x0,(entry *)ep,
             (client_data_t *)&eStack_58);
  entry::~entry(&eStack_58);
  return;
}

Assistant:

void session_handle::dht_direct_request(udp::endpoint const& ep, entry const& e
		, client_data_t userdata)
	{
#ifndef TORRENT_DISABLE_DHT
		entry copy = e;
		async_call(&session_impl::dht_direct_request, ep, copy, userdata);
#else
		TORRENT_UNUSED(ep);
		TORRENT_UNUSED(e);
		TORRENT_UNUSED(userdata);
#endif
	}